

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeClass * __thiscall
Parser::ParseClassDecl<true>
          (Parser *this,BOOL isDeclaration,LPCOLESTR pNameHint,uint32 *pHintLength,
          uint32 *pShortNameOffset)

{
  IdentPtr pIVar1;
  code *pcVar2;
  uint32 uVar3;
  ushort flags;
  ParseNodeType *pPVar4;
  bool bVar5;
  BOOL BVar6;
  charcount_t cVar7;
  uint32 uVar8;
  PageAllocator *pageAllocator;
  Scanner_t *pSVar9;
  HashTbl *hashTbl;
  BlockInfoStack *pBVar10;
  ParseNodeFnc *pPVar11;
  LPCWSTR pWVar12;
  ScriptConfiguration *pSVar13;
  ParseNodeBin *pPVar14;
  LPCOLESTR pOVar15;
  undefined4 *puVar16;
  ushort uVar17;
  char16_t *local_4b0;
  LPCOLESTR local_418;
  IdentPtr local_400;
  LPCOLESTR local_3d0;
  ParseNodeVar *local_3a8;
  bool local_37a;
  ParseNodeVar *local_368;
  char16_t *local_360;
  State local_308;
  State local_304;
  undefined1 local_2f8 [8];
  RestorePoint endClass;
  size_t cbLimConstructor;
  ParseNodeFnc *pnodeFnc_1;
  ParseNodeFnc *pnodeFnc;
  LPCOLESTR emptyHint_1;
  undefined1 local_298 [7];
  bool isGetter;
  RestorePoint beginMethodName;
  ParseNodePtr pnodeMember;
  State local_250;
  State state;
  uint32 constructorShortNameHintOffset;
  uint32 constructorNameLength;
  LPCOLESTR pConstructorName;
  LPCOLESTR emptyHint;
  undefined1 local_230 [7];
  bool isGenerator;
  RestorePoint parsedAsync;
  uint32 local_1f0;
  bool isAsyncMethod;
  uint32 uStack_1ec;
  bool isComputedName;
  uint32 memberNameOffset;
  uint32 memberNameHintLength;
  LPCOLESTR pMemberNameHint;
  IdentPtr pIStack_1d8;
  bool maybeAccessor;
  IdentPtr memberPid;
  IdentPtr pidHint;
  ParseNodePtr pnodeMemberName;
  size_t iecpMin;
  charcount_t ichMin;
  ushort fncDeclFlags;
  RestorePoint beginStatic;
  bool isStatic;
  IdentPtr pClassNamePid;
  RestorePoint beginClass;
  ParseNodeBlock *pnodeBlock;
  ParseNodePtr *ppnodeExprScopeSave;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodeVar *pnodeDeclName;
  BOOL strictSave;
  ParseNodeType *local_100;
  ParseNodeClass *pnodeClass;
  size_t cbMinConstructor;
  ArenaAllocator tempAllocator;
  uint32 nameHintOffset;
  uint32 nameHintLength;
  ParseNodePtr *lastMemberNodeRef;
  ParseNodePtr pnodeMembers;
  ParseNodePtr pnodeExtends;
  ParseNodeFnc *pnodeConstructor;
  ParseNodeVar *pnodeName;
  IdentPtr name;
  bool hasExtends;
  uint32 *puStack_30;
  bool hasConstructor;
  uint32 *pShortNameOffset_local;
  uint32 *pHintLength_local;
  LPCOLESTR pNameHint_local;
  Parser *pPStack_10;
  BOOL isDeclaration_local;
  Parser *this_local;
  
  name._7_1_ = 0;
  name._6_1_ = 0;
  pnodeName = (ParseNodeVar *)0x0;
  pnodeConstructor = (ParseNodeFnc *)0x0;
  pnodeExtends = (ParseNodePtr)0x0;
  pnodeMembers = (ParseNodePtr)0x0;
  lastMemberNodeRef = (ParseNodePtr *)0x0;
  _nameHintOffset = (ParseNode **)0x0;
  if (pHintLength == (uint32 *)0x0) {
    local_304 = Disallowed;
  }
  else {
    local_304 = *pHintLength;
  }
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _4_4_ = local_304;
  if (pShortNameOffset == (uint32 *)0x0) {
    local_308 = Disallowed;
  }
  else {
    local_308 = *pShortNameOffset;
  }
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _0_4_ = local_308;
  puStack_30 = pShortNameOffset;
  pShortNameOffset_local = pHintLength;
  pHintLength_local = (uint32 *)pNameHint;
  pNameHint_local._4_4_ = isDeclaration;
  pPStack_10 = this;
  pageAllocator =
       Memory::ArenaData::GetPageAllocator
                 (&(this->m_nodeAllocator).
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                   super_ArenaData);
  Memory::ArenaAllocator::ArenaAllocator
            ((ArenaAllocator *)&cbMinConstructor,L"ClassMemberNames",pageAllocator,OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  pnodeClass = (ParseNodeClass *)0x0;
  local_100 = (ParseNodeType *)0x0;
  local_100 = CreateNodeForOpT<(OpCode)86>(this);
  pSVar9 = GetScanner(this);
  pnodeClass = (ParseNodeClass *)Scanner<UTF8EncodingPolicyBase<false>_>::IecpMinTok(pSVar9);
  pnodeDeclName._0_4_ = this->m_fUseStrictMode;
  this->m_fUseStrictMode = 1;
  pSVar9 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar9);
  if ((this->m_token).tk == tkID) {
    hashTbl = GetHashTbl(this);
    pnodeName = (ParseNodeVar *)Token::GetIdentifier((Token *)&this->m_token,hashTbl);
    pSVar9 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar9);
  }
  else if (pNameHint_local._4_4_ != 0) {
    IdentifierExpectedError(this,&this->m_token);
  }
  if (((pNameHint_local._4_4_ != 0) &&
      (pnodeName == (ParseNodeVar *)(this->wellKnownPropertyPids).arguments)) &&
     (pBVar10 = GetCurrentBlockInfo(this), (pBVar10->pnodeBlock->field_0x5c & 3) == 1)) {
    pPVar11 = GetCurrentFunctionNode(this);
    (pPVar11->super_ParseNode).grfpn = (pPVar11->super_ParseNode).grfpn | 1;
  }
  ppnodeScopeSave = (ParseNodePtr *)0x0;
  if (pNameHint_local._4_4_ != 0) {
    ppnodeScopeSave =
         (ParseNodePtr *)CreateBlockScopedDeclNode(this,(IdentPtr)pnodeName,knopLetDecl);
  }
  ppnodeExprScopeSave = (ParseNodePtr *)0x0;
  pnodeBlock = (ParseNodeBlock *)0x0;
  beginClass.m_cMultiUnits =
       (Type)StartParseBlock<true>(this,Regular,ScopeType_Block,(LabelId *)0x0);
  PushFuncBlockScope(this,(ParseNodeBlock *)beginClass.m_cMultiUnits,&ppnodeExprScopeSave,
                     (ParseNodePtr **)&pnodeBlock);
  local_100->pnodeBlock = (ParseNodeBlock *)beginClass.m_cMultiUnits;
  if (pnodeName != (ParseNodeVar *)0x0) {
    pnodeConstructor =
         (ParseNodeFnc *)CreateBlockScopedDeclNode(this,(IdentPtr)pnodeName,knopConstDecl);
  }
  if ((this->m_token).tk == tkEXTENDS) {
    pSVar9 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar9);
    pnodeMembers = ParseTerm<true>(this,1,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                                   (IdentToken *)0x0,false,1,(BOOL *)0x0,(BOOL *)0x0,(bool *)0x0,
                                   (charcount_t *)0x0,(bool *)0x0);
    name._6_1_ = 1;
  }
  if ((this->m_token).tk != tkLCurly) {
    Error(this,-0x7ff5fc10,L"",L"");
  }
  pWVar12 = GetParseType(this);
  if (pnodeName == (ParseNodeVar *)0x0) {
    local_360 = L"anonymous class";
  }
  else {
    local_360 = Ident::Psz((Ident *)pnodeName);
  }
  Output::TraceWithFlush(ES6VerboseFlag,L"Parsing class (%s) : %s\n",pWVar12,local_360);
  RestorePoint::RestorePoint((RestorePoint *)&pClassNamePid);
  pSVar9 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar9,(RestorePoint *)&pClassNamePid);
  pSVar9 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid(pSVar9);
  if (pnodeConstructor == (ParseNodeFnc *)0x0) {
    local_368 = (ParseNodeVar *)0x0;
  }
  else {
    local_368 = pnodeConstructor->pnodeName;
  }
LAB_015513c2:
  do {
    while ((this->m_token).tk == tkSColon) {
      pSVar9 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid(pSVar9);
    }
    if ((this->m_token).tk == tkRCurly) {
      endClass.m_cMultiUnits = 0;
      pSVar9 = GetScanner(this);
      cVar7 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(pSVar9);
      (local_100->super_ParseNode).ichLim = cVar7;
      pSVar9 = GetScanner(this);
      endClass.m_cMultiUnits = Scanner<UTF8EncodingPolicyBase<false>_>::IecpLimTok(pSVar9);
      if ((name._7_1_ & 1) == 0) {
        pWVar12 = GetParseType(this);
        if (pnodeName == (ParseNodeVar *)0x0) {
          local_4b0 = L"anonymous class";
        }
        else {
          local_4b0 = Ident::Psz((Ident *)pnodeName);
        }
        Output::TraceWithFlush
                  (ES6VerboseFlag,L"Generating constructor (%s) : %s\n",pWVar12,local_4b0);
        RestorePoint::RestorePoint((RestorePoint *)local_2f8);
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar9,(RestorePoint *)local_2f8);
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar9,(RestorePoint *)&pClassNamePid);
        pnodeExtends = &GenerateEmptyConstructor<true>(this,pnodeMembers != (ParseNodePtr)0x0)->
                        super_ParseNode;
        if (local_368 == (ParseNodeVar *)0x0) {
          if (tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
              .freeList._4_4_ <
              (State)tempAllocator.
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     freeList) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                               ,0x2016,"(nameHintLength >= nameHintOffset)",
                               "nameHintLength >= nameHintOffset");
            if (!bVar5) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 0;
          }
          *(uint32 **)&pnodeExtends[2].ichLim = pHintLength_local;
          pnodeExtends[3].nop =
               tempAllocator.
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
               _4_1_;
          pnodeExtends[3].field_0x1 =
               tempAllocator.
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
               _5_1_;
          pnodeExtends[3].grfpn =
               tempAllocator.
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
               _6_2_;
          pnodeExtends[3].ichMin =
               (State)tempAllocator.
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      freeList;
        }
        else {
          pOVar15 = Ident::Psz((Ident *)local_368);
          *(LPCOLESTR *)&pnodeExtends[2].ichLim = pOVar15;
          uVar8 = Ident::Cch((Ident *)local_368);
          pnodeExtends[3].nop = (char)uVar8;
          pnodeExtends[3].field_0x1 = (char)(uVar8 >> 8);
          pnodeExtends[3].grfpn = (short)(uVar8 >> 0x10);
          pnodeExtends[3].ichMin = 0;
        }
        *(ParseNodeVar **)(pnodeExtends + 2) = local_368;
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar9,(RestorePoint *)local_2f8);
      }
      *(ParseNodeClass **)(pnodeExtends + 9) = pnodeClass;
      pnodeExtends[9].ichLim = (undefined4)endClass.m_cMultiUnits;
      pnodeExtends[9].location = endClass.m_cMultiUnits._4_4_;
      PopFuncBlockScope(this,ppnodeExprScopeSave,(ParseNodePtr *)pnodeBlock);
      local_100->pnodeDeclName = (ParseNodeVar *)ppnodeScopeSave;
      local_100->pnodeName = (ParseNodeVar *)pnodeConstructor;
      local_100->pnodeConstructor = (ParseNodeFnc *)pnodeExtends;
      local_100->pnodeExtends = pnodeMembers;
      local_100->pnodeMembers = (ParseNodePtr)lastMemberNodeRef;
      local_100->isDefaultModuleExport = false;
      FinishParseBlock(this,(ParseNodeBlock *)beginClass.m_cMultiUnits,true);
      this->m_fUseStrictMode = (BOOL)pnodeDeclName;
      pSVar9 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar9);
      pPVar4 = local_100;
      Memory::ArenaAllocator::~ArenaAllocator((ArenaAllocator *)&cbMinConstructor);
      return pPVar4;
    }
    beginStatic.m_cMultiUnits._7_1_ = 0;
    if ((this->m_token).tk == tkSTATIC) {
      RestorePoint::RestorePoint((RestorePoint *)&ichMin);
      pSVar9 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar9,(RestorePoint *)&ichMin);
      pSVar9 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid(pSVar9);
      if ((this->m_token).tk == tkLParen) {
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar9,(RestorePoint *)&ichMin);
      }
      else {
        beginStatic.m_cMultiUnits._7_1_ = 1;
      }
    }
    iecpMin._6_2_ = 0x68;
    pSVar9 = GetScanner(this);
    iecpMin._0_4_ = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(pSVar9);
    pSVar9 = GetScanner(this);
    pnodeMemberName = (ParseNodePtr)Scanner<UTF8EncodingPolicyBase<false>_>::IecpMinTok(pSVar9);
    pidHint = (IdentPtr)0x0;
    memberPid = (IdentPtr)0x0;
    pIStack_1d8 = (IdentPtr)0x0;
    pMemberNameHint._7_1_ = 0;
    _memberNameOffset = (LPCOLESTR)0x0;
    uStack_1ec = 0;
    local_1f0 = 0;
    parsedAsync.m_cMultiUnits._7_1_ = 0;
    parsedAsync.m_cMultiUnits._6_1_ = 0;
    bVar5 = CheckContextualKeyword(this,(this->wellKnownPropertyPids).async);
    if (bVar5) {
      pSVar13 = Js::ScriptContext::GetConfig(this->m_scriptContext);
      bVar5 = Js::ScriptConfiguration::IsES7AsyncAndAwaitEnabled(pSVar13);
      if (bVar5) {
        RestorePoint::RestorePoint((RestorePoint *)local_230);
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar9,(RestorePoint *)local_230);
        pSVar9 = GetScanner(this);
        iecpMin._0_4_ = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(pSVar9);
        pSVar9 = GetScanner(this);
        pnodeMemberName = (ParseNodePtr)Scanner<UTF8EncodingPolicyBase<false>_>::IecpMinTok(pSVar9);
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar9);
        if ((this->m_token).tk != tkLParen) {
          pSVar9 = GetScanner(this);
          BVar6 = Scanner<UTF8EncodingPolicyBase<false>_>::FHadNewLine(pSVar9);
          if (BVar6 == 0) {
            parsedAsync.m_cMultiUnits._6_1_ = 1;
            goto LAB_01551675;
          }
        }
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar9,(RestorePoint *)local_230);
      }
    }
LAB_01551675:
    pSVar13 = Js::ScriptContext::GetConfig(this->m_scriptContext);
    bVar5 = Js::ScriptConfiguration::IsES6GeneratorsEnabled(pSVar13);
    local_37a = false;
    if (bVar5) {
      local_37a = (this->m_token).tk == tkStar;
    }
    emptyHint._7_1_ = local_37a;
    if (local_37a != false) {
      iecpMin._6_2_ = iecpMin._6_2_ | 0x80;
      pSVar9 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid(pSVar9);
    }
    if ((this->m_token).tk == tkLBrack) {
      pSVar13 = Js::ScriptContext::GetConfig(this->m_scriptContext);
      bVar5 = Js::ScriptConfiguration::IsES6ObjectLiteralsEnabled(pSVar13);
      if (!bVar5) goto LAB_01551788;
      pConstructorName = (LPCOLESTR)0x0;
      ParseComputedName<true>
                (this,(ParseNodePtr *)&pidHint,&pConstructorName,(LPCOLESTR *)&memberNameOffset,
                 &stack0xfffffffffffffe14,&local_1f0);
      parsedAsync.m_cMultiUnits._7_1_ = 1;
    }
    else {
LAB_01551788:
      pSVar9 = GetScanner(this);
      bVar5 = Scanner<UTF8EncodingPolicyBase<false>_>::LastIdentifierHasEscape(pSVar9);
      pMemberNameHint._7_1_ = !bVar5;
      pIStack_1d8 = ParseClassPropertyName(this,&memberPid);
      if (memberPid != (IdentPtr)0x0) {
        _memberNameOffset = Ident::Psz(memberPid);
        uStack_1ec = Ident::Cch(memberPid);
      }
    }
    if (pIStack_1d8 != (IdentPtr)0x0) {
      pidHint = (IdentPtr)CreateStrNode(this,pIStack_1d8);
    }
    if (((beginStatic.m_cMultiUnits._7_1_ & 1) != 0) ||
       (pIStack_1d8 != (this->wellKnownPropertyPids).constructor)) {
      beginMethodName.m_cMultiUnits = 0;
      RestorePoint::RestorePoint((RestorePoint *)local_298);
      pSVar9 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar9,(RestorePoint *)local_298);
      if (((pMemberNameHint._7_1_ & 1) != 0) &&
         ((pIStack_1d8 == (this->wellKnownPropertyPids).get ||
          (pIStack_1d8 == (this->wellKnownPropertyPids).set)))) {
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid(pSVar9);
      }
      if ((this->m_token).tk == tkLParen) {
        pSVar9 = GetScanner(this);
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar9,(RestorePoint *)local_298);
        pMemberNameHint._7_1_ = 0;
      }
      if (((pMemberNameHint._7_1_ & 1) == 0) ||
         ((pIStack_1d8 != (this->wellKnownPropertyPids).get &&
          (pIStack_1d8 != (this->wellKnownPropertyPids).set)))) {
        if (((beginStatic.m_cMultiUnits._7_1_ & 1) != 0) &&
           (pIStack_1d8 == (this->wellKnownPropertyPids).prototype)) {
          Error(this,-0x7ff5fc16,L"",L"");
        }
        if ((parsedAsync.m_cMultiUnits._6_1_ & 1) != 0) {
          iecpMin._6_2_ = iecpMin._6_2_ | 0x100;
        }
        flags = iecpMin._6_2_;
        if (memberPid == (IdentPtr)0x0) {
          local_418 = (LPCOLESTR)0x0;
        }
        else {
          local_418 = Ident::Psz(memberPid);
        }
        pPVar11 = ParseFncDeclNoCheckScope<true>
                            (this,flags,PropertyAllowed,local_418,true,false,true);
        if ((((parsedAsync.m_cMultiUnits._6_1_ & 1) != 0) || ((emptyHint._7_1_ & 1) != 0)) ||
           ((parsedAsync.m_cMultiUnits._7_1_ & 1) != 0)) {
          pPVar11->cbStringMin = (size_t)pnodeMemberName;
          pPVar11->cbStringLim = pPVar11->cbLim;
        }
        ParseNodeFnc::SetIsStaticMember(pPVar11,(bool)(beginStatic.m_cMultiUnits._7_1_ & 1));
        if ((parsedAsync.m_cMultiUnits._7_1_ & 1) != 0) {
          ParseNodeFnc::SetHasComputedName(pPVar11,true);
        }
        ParseNodeFnc::SetHasHomeObj(pPVar11,true);
        beginMethodName.m_cMultiUnits =
             (Type)CreateBinNode(this,knopMember,(ParseNodePtr)pidHint,&pPVar11->super_ParseNode);
        _memberNameOffset =
             ConstructFinalHintNode
                       (this,(IdentPtr)local_368,memberPid,(IdentPtr)0x0,
                        (bool)(beginStatic.m_cMultiUnits._7_1_ & 1),&stack0xfffffffffffffe14,
                        &local_1f0,(bool)(parsedAsync.m_cMultiUnits._7_1_ & 1),_memberNameOffset);
      }
      else {
        emptyHint_1._7_1_ = pIStack_1d8 == (this->wellKnownPropertyPids).get;
        if ((this->m_token).tk == tkLBrack) {
          pSVar13 = Js::ScriptContext::GetConfig(this->m_scriptContext);
          bVar5 = Js::ScriptConfiguration::IsES6ObjectLiteralsEnabled(pSVar13);
          if (!bVar5) goto LAB_01551c61;
          pnodeFnc = (ParseNodeFnc *)0x0;
          ParseComputedName<true>
                    (this,(ParseNodePtr *)&pidHint,(LPCOLESTR *)&pnodeFnc,
                     (LPCOLESTR *)&memberNameOffset,&stack0xfffffffffffffe14,&local_1f0);
          parsedAsync.m_cMultiUnits._7_1_ = 1;
        }
        else {
LAB_01551c61:
          pIStack_1d8 = ParseClassPropertyName(this,&memberPid);
        }
        if ((beginStatic.m_cMultiUnits._7_1_ & 1) == 0) {
          pIVar1 = (this->wellKnownPropertyPids).constructor;
        }
        else {
          pIVar1 = (this->wellKnownPropertyPids).prototype;
        }
        if ((pIStack_1d8 == pIVar1) || ((parsedAsync.m_cMultiUnits._6_1_ & 1) != 0)) {
          Error(this,-0x7ff5fc16,L"",L"");
        }
        if ((pIStack_1d8 != (IdentPtr)0x0) && ((parsedAsync.m_cMultiUnits._7_1_ & 1) == 0)) {
          pidHint = (IdentPtr)CreateStrNode(this,pIStack_1d8);
        }
        uVar17 = 4;
        if ((emptyHint_1._7_1_ & knopName) != knopNone) {
          uVar17 = 2;
        }
        uVar17 = iecpMin._6_2_ | uVar17;
        if (memberPid == (IdentPtr)0x0) {
          local_3d0 = (LPCOLESTR)0x0;
        }
        else {
          local_3d0 = Ident::Psz(memberPid);
        }
        pPVar11 = ParseFncDeclNoCheckScope<true>
                            (this,uVar17,PropertyAllowed,local_3d0,true,false,true);
        ParseNodeFnc::SetIsStaticMember(pPVar11,(bool)(beginStatic.m_cMultiUnits._7_1_ & 1));
        if ((parsedAsync.m_cMultiUnits._7_1_ & 1) != 0) {
          ParseNodeFnc::SetHasComputedName(pPVar11,true);
        }
        ParseNodeFnc::SetHasHomeObj(pPVar11,true);
        ParseNodeFnc::SetIsAccessor(pPVar11,true);
        beginMethodName.m_cMultiUnits =
             (Type)CreateBinNode(this,emptyHint_1._7_1_ & knopName | knopSetMember,
                                 (ParseNodePtr)pidHint,&pPVar11->super_ParseNode);
        if ((emptyHint_1._7_1_ & knopName) == knopNone) {
          local_400 = (this->wellKnownPropertyPids).set;
        }
        else {
          local_400 = (this->wellKnownPropertyPids).get;
        }
        _memberNameOffset =
             ConstructFinalHintNode
                       (this,(IdentPtr)local_368,memberPid,local_400,
                        (bool)(beginStatic.m_cMultiUnits._7_1_ & 1),&stack0xfffffffffffffe14,
                        &local_1f0,(bool)(parsedAsync.m_cMultiUnits._7_1_ & 1),_memberNameOffset);
      }
      if (uStack_1ec < local_1f0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x1ff0,"(memberNameHintLength >= memberNameOffset)",
                           "memberNameHintLength >= memberNameOffset");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      pOVar15 = _memberNameOffset;
      pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)beginMethodName.m_cMultiUnits);
      pPVar11 = ParseNode::AsParseNodeFnc(pPVar14->pnode2);
      uVar3 = uStack_1ec;
      pPVar11->hint = pOVar15;
      pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)beginMethodName.m_cMultiUnits);
      pPVar11 = ParseNode::AsParseNodeFnc(pPVar14->pnode2);
      uVar8 = local_1f0;
      pPVar11->hintLength = uVar3;
      pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)beginMethodName.m_cMultiUnits);
      pPVar11 = ParseNode::AsParseNodeFnc(pPVar14->pnode2);
      pIVar1 = pIStack_1d8;
      pPVar11->hintOffset = uVar8;
      pPVar14 = ParseNode::AsParseNodeBin((ParseNode *)beginMethodName.m_cMultiUnits);
      pPVar11 = ParseNode::AsParseNodeFnc(pPVar14->pnode2);
      pPVar11->pid = pIVar1;
      AddToNodeList(this,(ParseNode **)&lastMemberNodeRef,(ParseNode ***)&nameHintOffset,
                    (ParseNode *)beginMethodName.m_cMultiUnits);
      goto LAB_015513c2;
    }
    if (((name._7_1_ & 1) != 0) || ((parsedAsync.m_cMultiUnits._6_1_ & 1) != 0)) {
      Error(this,-0x7ff5fc16,L"",L"");
    }
    name._7_1_ = 1;
    local_250 = Disallowed;
    if ((pnodeConstructor == (ParseNodeFnc *)0x0) ||
       (pnodeConstructor->pnodeName == (ParseNodeVar *)0x0)) {
      _constructorShortNameHintOffset = (LPCOLESTR)pHintLength_local;
      state = tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
              .freeList._4_4_;
      local_250 = (State)tempAllocator.
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         freeList;
    }
    else {
      _constructorShortNameHintOffset = Ident::Psz((Ident *)pnodeConstructor->pnodeName);
      state = Ident::Cch((Ident *)pnodeConstructor->pnodeName);
    }
    iecpMin._6_2_ = ((byte)~name._6_1_ & 1) << 0xb | iecpMin._6_2_ | 0x400;
    pnodeExtends = &ParseFncDeclNoCheckScope<true>
                              (this,iecpMin._6_2_,PropertyAllowed - (name._6_1_ & 1),
                               _constructorShortNameHintOffset,true,false,true)->super_ParseNode;
    bVar5 = ParseNodeFnc::IsGenerator((ParseNodeFnc *)pnodeExtends);
    if (bVar5) {
      Error(this,-0x7ff5fbce,L"",L"");
    }
    if (state < local_250) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x1f82,"(constructorNameLength >= constructorShortNameHintOffset)",
                         "constructorNameLength >= constructorShortNameHintOffset");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    *(LPCOLESTR *)&pnodeExtends[2].ichLim = _constructorShortNameHintOffset;
    pnodeExtends[3].nop = (undefined1)state;
    pnodeExtends[3].field_0x1 = state._1_1_;
    pnodeExtends[3].grfpn = state._2_2_;
    pnodeExtends[3].ichMin = local_250;
    if ((pnodeConstructor == (ParseNodeFnc *)0x0) ||
       (pnodeConstructor->pnodeName == (ParseNodeVar *)0x0)) {
      local_3a8 = (ParseNodeVar *)(this->wellKnownPropertyPids).constructor;
    }
    else {
      local_3a8 = pnodeConstructor->pnodeName;
    }
    *(ParseNodeVar **)(pnodeExtends + 2) = local_3a8;
    ParseNodeFnc::SetHasNonThisStmt((ParseNodeFnc *)pnodeExtends,true);
    ParseNodeFnc::SetHasHomeObj((ParseNodeFnc *)pnodeExtends,true);
  } while( true );
}

Assistant:

ParseNodeClass * Parser::ParseClassDecl(BOOL isDeclaration, LPCOLESTR pNameHint, uint32 *pHintLength, uint32 *pShortNameOffset)
{
    bool hasConstructor = false;
    bool hasExtends = false;
    IdentPtr name = nullptr;
    ParseNodeVar * pnodeName = nullptr;
    ParseNodeFnc * pnodeConstructor = nullptr;
    ParseNodePtr pnodeExtends = nullptr;
    ParseNodePtr pnodeMembers = nullptr;
    ParseNodePtr *lastMemberNodeRef = nullptr;
    uint32 nameHintLength = pHintLength ? *pHintLength : 0;
    uint32 nameHintOffset = pShortNameOffset ? *pShortNameOffset : 0;

    ArenaAllocator tempAllocator(_u("ClassMemberNames"), m_nodeAllocator.GetPageAllocator(), Parser::OutOfMemory);

    size_t cbMinConstructor = 0;
    ParseNodeClass * pnodeClass = nullptr;
    if (buildAST)
    {
        pnodeClass = CreateNodeForOpT<knopClassDecl>();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Class, m_scriptContext);

        cbMinConstructor = this->GetScanner()->IecpMinTok();
    }

    BOOL strictSave = m_fUseStrictMode;
    m_fUseStrictMode = TRUE;

    this->GetScanner()->Scan();
    if (m_token.tk == tkID)
    {
        name = m_token.GetIdentifier(this->GetHashTbl());
        this->GetScanner()->Scan();
    }
    else if (isDeclaration)
    {
        IdentifierExpectedError(m_token);
    }

    if (isDeclaration && name == wellKnownPropertyPids.arguments && GetCurrentBlockInfo()->pnodeBlock->blockType == Function)
    {
        GetCurrentFunctionNode()->grfpn |= PNodeFlags::fpnArguments_overriddenByDecl;
    }

    ParseNodeVar * pnodeDeclName = nullptr;
    if (isDeclaration)
    {
        pnodeDeclName = CreateBlockScopedDeclNode(name, knopLetDecl);
    }

    ParseNodePtr *ppnodeScopeSave = nullptr;
    ParseNodePtr *ppnodeExprScopeSave = nullptr;

    ParseNodeBlock * pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Regular, ScopeType_Block);
    if (buildAST)
    {
        PushFuncBlockScope(pnodeBlock, &ppnodeScopeSave, &ppnodeExprScopeSave);
        pnodeClass->pnodeBlock = pnodeBlock;
    }

    if (name)
    {
        pnodeName = CreateBlockScopedDeclNode(name, knopConstDecl);
    }

    if (m_token.tk == tkEXTENDS)
    {
        this->GetScanner()->Scan();
        pnodeExtends = ParseTerm<buildAST>();
        hasExtends = true;
    }

    if (m_token.tk != tkLCurly)
    {
        Error(ERRnoLcurly);
    }

    OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Parsing class (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

    RestorePoint beginClass;
    this->GetScanner()->Capture(&beginClass);

    this->GetScanner()->ScanForcingPid();

    IdentPtr pClassNamePid = pnodeName ? pnodeName->pid : nullptr;

    for (;;)
    {
        if (m_token.tk == tkSColon)
        {
            this->GetScanner()->ScanForcingPid();
            continue;
        }
        if (m_token.tk == tkRCurly)
        {
            break;
        }

        bool isStatic = false;
        if (m_token.tk == tkSTATIC)
        {
            // 'static' can be used as an IdentifierName here, even in strict mode code. We need to see the next token before we know
            // if this is being used as a keyword. This is similar to the way we treat 'let' in some cases.
            // See https://tc39.github.io/ecma262/#sec-keywords for more info.

            RestorePoint beginStatic;
            this->GetScanner()->Capture(&beginStatic);

            this->GetScanner()->ScanForcingPid();

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginStatic);
            }
            else
            {
                isStatic = true;
            }
        }

        ushort fncDeclFlags = fFncNoName | fFncMethod | fFncClassMember;
        charcount_t ichMin = this->GetScanner()->IchMinTok();
        size_t iecpMin = this->GetScanner()->IecpMinTok();
        ParseNodePtr pnodeMemberName = nullptr;
        IdentPtr pidHint = nullptr;
        IdentPtr memberPid = nullptr;
        bool maybeAccessor = false;
        LPCOLESTR pMemberNameHint = nullptr;
        uint32 memberNameHintLength = 0;
        uint32 memberNameOffset = 0;
        bool isComputedName = false;
        bool isAsyncMethod = false;

        if (CheckContextualKeyword(wellKnownPropertyPids.async) && m_scriptContext->GetConfig()->IsES7AsyncAndAwaitEnabled())
        {
            RestorePoint parsedAsync;
            this->GetScanner()->Capture(&parsedAsync);
            ichMin = this->GetScanner()->IchMinTok();
            iecpMin = this->GetScanner()->IecpMinTok();

            this->GetScanner()->Scan();
            if (m_token.tk == tkLParen || this->GetScanner()->FHadNewLine())
            {
                this->GetScanner()->SeekTo(parsedAsync);
            }
            else
            {
                isAsyncMethod = true;
            }
        }

        bool isGenerator = m_scriptContext->GetConfig()->IsES6GeneratorsEnabled() &&
            m_token.tk == tkStar;
        if (isGenerator)
        {
            fncDeclFlags |= fFncGenerator;
            this->GetScanner()->ScanForcingPid();
        }


        if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
        {
            // Computed member name: [expr] () { }
            LPCOLESTR emptyHint = nullptr;
            ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
            isComputedName = true;
        }
        else // not computed name
        {
            maybeAccessor = !this->GetScanner()->LastIdentifierHasEscape();
            memberPid = this->ParseClassPropertyName(&pidHint);
            if (pidHint)
            {
                pMemberNameHint = pidHint->Psz();
                memberNameHintLength = pidHint->Cch();
            }
        }

        if (buildAST && memberPid)
        {
            pnodeMemberName = CreateStrNode(memberPid);
        }

        if (!isStatic && memberPid == wellKnownPropertyPids.constructor)
        {
            if (hasConstructor || isAsyncMethod)
            {
                Error(ERRsyntax);
            }
            hasConstructor = true;
            LPCOLESTR pConstructorName = nullptr;
            uint32  constructorNameLength = 0;
            uint32  constructorShortNameHintOffset = 0;
            if (pnodeName && pnodeName->pid)
            {
                pConstructorName = pnodeName->pid->Psz();
                constructorNameLength = pnodeName->pid->Cch();
            }
            else
            {
                pConstructorName = pNameHint;
                constructorNameLength = nameHintLength;
                constructorShortNameHintOffset = nameHintOffset;
            }

            {
                SuperRestrictionState::State state = hasExtends ? SuperRestrictionState::CallAndPropertyAllowed : SuperRestrictionState::PropertyAllowed;

                // Add the class constructor flag and base class constructor flag if pnodeExtends is nullptr
                fncDeclFlags |= fFncClassConstructor | (hasExtends ? kFunctionNone : fFncBaseClassConstructor);
                pnodeConstructor = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, state, pConstructorName, /* needsPIDOnRCurlyScan */ true);
            }

            if (pnodeConstructor->IsGenerator())
            {
                Error(ERRConstructorCannotBeGenerator);
            }

            Assert(constructorNameLength >= constructorShortNameHintOffset);
            // The constructor function will get the same name as class.
            pnodeConstructor->hint = pConstructorName;
            pnodeConstructor->hintLength = constructorNameLength;
            pnodeConstructor->hintOffset = constructorShortNameHintOffset;
            pnodeConstructor->pid = pnodeName && pnodeName->pid ? pnodeName->pid : wellKnownPropertyPids.constructor;
            pnodeConstructor->SetHasNonThisStmt();
            pnodeConstructor->SetHasHomeObj();
        }
        else
        {
            ParseNodePtr pnodeMember = nullptr;
            RestorePoint beginMethodName;
            this->GetScanner()->Capture(&beginMethodName);

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                this->GetScanner()->ScanForcingPid();
            }

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginMethodName);
                maybeAccessor = false;
            }

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                bool isGetter = (memberPid == wellKnownPropertyPids.get);

                if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
                {
                    // Computed get/set member name: get|set [expr] () { }
                    LPCOLESTR emptyHint = nullptr;
                    ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
                    isComputedName = true;
                }
                else // not computed name
                {
                    memberPid = this->ParseClassPropertyName(&pidHint);
                }

                if ((isStatic ? (memberPid == wellKnownPropertyPids.prototype) : (memberPid == wellKnownPropertyPids.constructor)) || isAsyncMethod)
                {
                    Error(ERRsyntax);
                }
                if (buildAST && memberPid && !isComputedName)
                {
                    pnodeMemberName = CreateStrNode(memberPid);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags | (isGetter ? fFncNoArg : fFncOneArg),
                        SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);
                }

                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeFnc->SetIsAccessor();
                    pnodeMember = CreateBinNode(isGetter ? knopGetMember : knopSetMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint,
                        isGetter ? wellKnownPropertyPids.get : wellKnownPropertyPids.set, isStatic,
                        &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }
            else
            {
                if (isStatic && (memberPid == wellKnownPropertyPids.prototype))
                {
                    Error(ERRsyntax);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    if (isAsyncMethod)
                    {
                        fncDeclFlags |= fFncAsync;
                    }
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);

                    if (isAsyncMethod || isGenerator || isComputedName)
                    {
                        pnodeFnc->cbStringMin = iecpMin;
                        pnodeFnc->cbStringLim = pnodeFnc->cbLim;
                    }
                }
                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeMember = CreateBinNode(knopMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint, nullptr /*pgetset*/, isStatic, &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }

            if (buildAST)
            {
                Assert(memberNameHintLength >= memberNameOffset);
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hint = pMemberNameHint; // Fully qualified name
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintLength = memberNameHintLength;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintOffset = memberNameOffset;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->pid = memberPid; // Short name

                AddToNodeList(&pnodeMembers, &lastMemberNodeRef, pnodeMember);
            }
        }
    }

    size_t cbLimConstructor = 0;
    if (buildAST)
    {
        pnodeClass->ichLim = this->GetScanner()->IchLimTok();
        cbLimConstructor = this->GetScanner()->IecpLimTok();
    }

    if (!hasConstructor)
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Generating constructor (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

        RestorePoint endClass;
        this->GetScanner()->Capture(&endClass);
        this->GetScanner()->SeekTo(beginClass);

        pnodeConstructor = GenerateEmptyConstructor<buildAST>(pnodeExtends != nullptr);

        if (buildAST)
        {
            if (pClassNamePid)
            {
                pnodeConstructor->hint = pClassNamePid->Psz();
                pnodeConstructor->hintLength = pClassNamePid->Cch();
                pnodeConstructor->hintOffset = 0;
            }
            else
            {
                Assert(nameHintLength >= nameHintOffset);
                pnodeConstructor->hint = pNameHint;
                pnodeConstructor->hintLength = nameHintLength;
                pnodeConstructor->hintOffset = nameHintOffset;
            }
            pnodeConstructor->pid = pClassNamePid;
        }

        this->GetScanner()->SeekTo(endClass);
    }

    if (buildAST)
    {
        pnodeConstructor->cbStringMin = cbMinConstructor;
        pnodeConstructor->cbStringLim = cbLimConstructor;

        PopFuncBlockScope(ppnodeScopeSave, ppnodeExprScopeSave);

        pnodeClass->pnodeDeclName = pnodeDeclName;
        pnodeClass->pnodeName = pnodeName;
        pnodeClass->pnodeConstructor = pnodeConstructor;
        pnodeClass->pnodeExtends = pnodeExtends;
        pnodeClass->pnodeMembers = pnodeMembers;
        pnodeClass->isDefaultModuleExport = false;
    }
    FinishParseBlock(pnodeBlock);

    m_fUseStrictMode = strictSave;

    this->GetScanner()->Scan();

    return pnodeClass;
}